

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

Namespace * __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::visit
          (QualifiedIdentifierResolver *this,Namespace *n)

{
  Namespace *pNVar1;
  Namespace *result;
  pool_ptr<soul::AST::ModuleBase> local_20;
  pool_ptr<soul::AST::ModuleBase> lastModule;
  Namespace *n_local;
  QualifiedIdentifierResolver *this_local;
  
  local_20.object = (this->currentModule).object;
  lastModule.object = &n->super_ModuleBase;
  pool_ptr<soul::AST::ModuleBase>::pool_ptr<soul::AST::Namespace,void>
            ((pool_ptr<soul::AST::ModuleBase> *)&result,n);
  (this->currentModule).object = &result->super_ModuleBase;
  pool_ptr<soul::AST::ModuleBase>::~pool_ptr((pool_ptr<soul::AST::ModuleBase> *)&result);
  pNVar1 = ModuleInstanceResolver::visit
                     (&this->super_ModuleInstanceResolver,(Namespace *)lastModule.object);
  (this->currentModule).object = local_20.object;
  pool_ptr<soul::AST::ModuleBase>::~pool_ptr(&local_20);
  return pNVar1;
}

Assistant:

AST::Namespace& visit (AST::Namespace& n) override
        {
            auto lastModule = currentModule;
            currentModule = n;
            auto& result = ModuleInstanceResolver::visit (n);
            currentModule = lastModule;
            return result;
        }